

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynet.h
# Opt level: O1

VariableIndex __thiscall
dynet::ComputationGraph::add_function<dynet::MomentDimension,unsigned_int&,unsigned_int&>
          (ComputationGraph *this,initializer_list<unsigned_int> *arguments,uint *side_information,
          uint *side_information_1)

{
  pointer *pppNVar1;
  uint uVar2;
  uint uVar3;
  iterator __position;
  Node *pNVar4;
  Device **ppDVar5;
  VariableIndex new_node_index;
  allocator_type local_3d;
  VariableIndex local_3c;
  Node *local_38;
  
  local_3c = (VariableIndex)
             ((ulong)((long)(this->nodes).
                            super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->nodes).
                           super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl
                           .super__Vector_impl_data._M_start) >> 3);
  pNVar4 = (Node *)operator_new(0x68);
  uVar2 = *side_information;
  uVar3 = *side_information_1;
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_005bafc8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&pNVar4->args,*arguments,&local_3d);
  (pNVar4->dim).nd = 0;
  (pNVar4->dim).bd = 1;
  pNVar4->device = (Device *)0x0;
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_005be6b0;
  *(uint *)&pNVar4[1]._vptr_Node = uVar2;
  *(uint *)((long)&pNVar4[1]._vptr_Node + 4) = uVar3;
  __position._M_current =
       (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38 = pNVar4;
  if (__position._M_current ==
      (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<dynet::Node*,std::allocator<dynet::Node*>>::_M_realloc_insert<dynet::Node*>
              ((vector<dynet::Node*,std::allocator<dynet::Node*>> *)this,__position,&local_38);
  }
  else {
    *__position._M_current = pNVar4;
    pppNVar1 = &(this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  pNVar4 = (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  if (pNVar4->device == (Device *)0x0) {
    if (arguments->_M_len == 0) {
      ppDVar5 = (Device **)&dynet::default_device;
    }
    else {
      ppDVar5 = &(this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[*arguments->_M_array]->device;
    }
    pNVar4->device = *ppDVar5;
  }
  set_dim_for_new_node(this,&local_3c);
  return local_3c;
}

Assistant:

inline VariableIndex ComputationGraph::add_function(const std::initializer_list<VariableIndex>& arguments,
    Args&&... side_information) {
  VariableIndex new_node_index(nodes.size());
  nodes.push_back(new Function(arguments, std::forward<Args>(side_information)...));
  if (nodes.back()->device == nullptr) {
    if (arguments.size()) {
      nodes.back()->device = nodes[*arguments.begin()]->device;
    } else {
      nodes.back()->device = dynet::default_device;
    }
  }
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}